

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_streambuf.hpp
# Opt level: O0

const_buffers_type __thiscall
asio::basic_streambuf<std::allocator<char>_>::data(basic_streambuf<std::allocator<char>_> *this)

{
  void *data;
  long lVar1;
  long lVar2;
  const_buffer cVar3;
  const_buffer local_28 [2];
  
  data = (void *)std::streambuf::gptr();
  lVar1 = std::streambuf::pptr();
  lVar2 = std::streambuf::gptr();
  const_buffer::const_buffer(local_28,data,lVar1 - lVar2);
  cVar3 = (const_buffer)asio::buffer((const_buffer *)0x2741fc);
  return (const_buffers_type)cVar3;
}

Assistant:

const_buffers_type data() const ASIO_NOEXCEPT
  {
    return asio::buffer(asio::const_buffer(gptr(),
          (pptr() - gptr()) * sizeof(char_type)));
  }